

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::upgradeToWebSocket
          (anon_unknown_31 *this,Own<kj::AsyncIoStream> *stream,HttpInputStreamImpl *httpInput,
          HttpOutputStream *httpOutput,Maybe<kj::EntropySource_&> maskKeyGenerator)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  size_t sVar4;
  WebSocketImpl *this_00;
  WebSocket *extraout_RDX;
  Own<kj::WebSocket> OVar5;
  ArrayPtr<unsigned_char> leftover;
  ReleasedBuffer releasedBuffer;
  undefined1 local_d8 [32];
  Array<unsigned_char> local_b8;
  PromiseNode *local_a0;
  size_t local_98;
  Own<kj::AsyncIoStream> local_88;
  Own<kj::(anonymous_namespace)::WebSocketImpl> local_70;
  Array<unsigned_char> local_60;
  NullableValue<kj::Promise<void>_> local_48;
  
  puVar1 = (uchar *)(httpInput->headerBuffer).ptr;
  sVar2 = (httpInput->headerBuffer).size_;
  pAVar3 = (httpInput->headerBuffer).disposer;
  (httpInput->headerBuffer).ptr = (char *)0x0;
  (httpInput->headerBuffer).size_ = 0;
  local_d8._16_8_ = (httpInput->leftover).ptr;
  sVar4 = (httpInput->leftover).size_;
  local_d8._24_8_ = maskKeyGenerator.ptr;
  local_b8.ptr = puVar1;
  local_b8.size_ = sVar2;
  local_b8.disposer = pAVar3;
  local_a0 = (PromiseNode *)local_d8._16_8_;
  local_98 = sVar4;
  HttpOutputStream::flush((HttpOutputStream *)local_d8);
  this_00 = (WebSocketImpl *)operator_new(0xe0);
  local_88.disposer = stream->disposer;
  local_88.ptr = stream->ptr;
  stream->ptr = (AsyncIoStream *)0x0;
  local_b8.ptr = (uchar *)0x0;
  local_b8.size_ = 0;
  local_48.isSet = true;
  local_48.field_1.value.super_PromiseBase.node.disposer = (Disposer *)local_d8._0_8_;
  local_48.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)local_d8._8_8_;
  local_d8._8_8_ = (Disposer *)0x0;
  leftover.size_ = sVar4;
  leftover.ptr = (uchar *)local_d8._16_8_;
  local_60.ptr = puVar1;
  local_60.size_ = sVar2;
  local_60.disposer = pAVar3;
  WebSocketImpl::WebSocketImpl
            (this_00,&local_88,(Maybe<kj::EntropySource_&>)local_d8._24_8_,&local_60,leftover,
             (Maybe<kj::Promise<void>_> *)&local_48);
  local_70.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl>::instance;
  local_70.ptr = this_00;
  _::NullableValue<kj::Promise<void>_>::~NullableValue(&local_48);
  Array<unsigned_char>::~Array(&local_60);
  Own<kj::AsyncIoStream>::dispose(&local_88);
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl>::instance;
  *(WebSocketImpl **)(this + 8) = this_00;
  local_70.ptr = (WebSocketImpl *)0x0;
  Own<kj::(anonymous_namespace)::WebSocketImpl>::~Own(&local_70);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_d8);
  Array<unsigned_char>::~Array(&local_b8);
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<WebSocket> upgradeToWebSocket(
    kj::Own<kj::AsyncIoStream> stream, HttpInputStreamImpl& httpInput, HttpOutputStream& httpOutput,
    kj::Maybe<EntropySource&> maskKeyGenerator) {
  // Create a WebSocket upgraded from an HTTP stream.
  auto releasedBuffer = httpInput.releaseBuffer();
  return kj::heap<WebSocketImpl>(kj::mv(stream), maskKeyGenerator,
                                 kj::mv(releasedBuffer.buffer), releasedBuffer.leftover,
                                 httpOutput.flush());
}